

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O1

void __thiscall Tunings::Scale::Scale(Scale *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"empty scale","");
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->description,"");
  (this->rawText)._M_dataplus._M_p = (pointer)&(this->rawText).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->rawText,"");
  this->count = 0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tones).super__Vector_base<Tunings::Tone,_std::allocator<Tunings::Tone>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Scale() : name("empty scale"), description(""), rawText(""), count(0) {}